

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ActivationParams::MergePartialFromCodedStream
          (ActivationParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  ActivationSoftsign *this_00;
  ActivationTanh *this_01;
  ActivationSoftplus *this_02;
  ActivationSigmoid *this_03;
  ActivationReLU *this_04;
  ActivationELU *this_05;
  ActivationScaledTanh *this_06;
  ActivationParametricSoftplus *this_07;
  ActivationLinear *this_08;
  ActivationThresholdedReLU *this_09;
  ActivationPReLU *this_10;
  ActivationSigmoidHard *this_11;
  ActivationLeakyReLU *this_12;
  pair<int,_int> pVar9;
  char cVar10;
  Limit limit;
  ulong uVar11;
  CodedInputStream *pCVar12;
  
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_0045f87f;
        uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_0045f87f:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) {
LAB_0045eff4:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    }
    else {
      uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar6 < 0x1f) {
        if (uVar6 < 0x14) {
          if (uVar6 == 5) {
            if (cVar10 == '*') {
              if (this->_oneof_case_[0] == 5) {
                this_08 = (this->NonlinearityType_).linear_;
              }
              else {
                clear_NonlinearityType(this);
                this->_oneof_case_[0] = 5;
                this_08 = (ActivationLinear *)operator_new(0x20);
                ActivationLinear::ActivationLinear(this_08);
                (this->NonlinearityType_).linear_ = this_08;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                (input,iVar7);
              if ((long)pVar9 < 0) {
                return false;
              }
              bVar5 = ActivationLinear::MergePartialFromCodedStream(this_08,input);
              goto LAB_0045f866;
            }
          }
          else if (uVar6 == 10) {
            if (cVar10 == 'R') {
              if (this->_oneof_case_[0] != 10) {
                clear_NonlinearityType(this);
                this->_oneof_case_[0] = 10;
                this_04 = (ActivationReLU *)operator_new(0x18);
                ActivationReLU::ActivationReLU(this_04);
                (this->NonlinearityType_).relu_ = this_04;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pCVar12 = input;
              pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                (input,iVar7);
              if ((long)pVar9 < 0) {
                return false;
              }
              bVar5 = ActivationReLU::MergePartialFromCodedStream((ActivationReLU *)pCVar12,input);
              goto LAB_0045f831;
            }
          }
          else if ((uVar6 == 0xf) && (cVar10 == 'z')) {
            if (this->_oneof_case_[0] == 0xf) {
              this_12 = (this->NonlinearityType_).leakyrelu_;
            }
            else {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0xf;
              this_12 = (ActivationLeakyReLU *)operator_new(0x18);
              ActivationLeakyReLU::ActivationLeakyReLU(this_12);
              (this->NonlinearityType_).leakyrelu_ = this_12;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = ActivationLeakyReLU::MergePartialFromCodedStream(this_12,input);
            goto LAB_0045f866;
          }
        }
        else if (uVar6 == 0x14) {
          if (cVar10 == -0x5e) {
            if (this->_oneof_case_[0] == 0x14) {
              this_09 = (this->NonlinearityType_).thresholdedrelu_;
            }
            else {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x14;
              this_09 = (ActivationThresholdedReLU *)operator_new(0x18);
              ActivationThresholdedReLU::ActivationThresholdedReLU(this_09);
              (this->NonlinearityType_).thresholdedrelu_ = this_09;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = ActivationThresholdedReLU::MergePartialFromCodedStream(this_09,input);
            goto LAB_0045f866;
          }
        }
        else if (uVar6 == 0x19) {
          if (cVar10 == -0x36) {
            if (this->_oneof_case_[0] == 0x19) {
              this_10 = (this->NonlinearityType_).prelu_;
            }
            else {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x19;
              this_10 = (ActivationPReLU *)operator_new(0x20);
              ActivationPReLU::ActivationPReLU(this_10);
              (this->NonlinearityType_).prelu_ = this_10;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = ActivationPReLU::MergePartialFromCodedStream(this_10,input);
            goto LAB_0045f866;
          }
        }
        else if ((uVar6 == 0x1e) && (cVar10 == -0xe)) {
          if (this->_oneof_case_[0] != 0x1e) {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x1e;
            this_01 = (ActivationTanh *)operator_new(0x18);
            ActivationTanh::ActivationTanh(this_01);
            (this->NonlinearityType_).tanh_ = this_01;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pCVar12 = input;
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = ActivationTanh::MergePartialFromCodedStream((ActivationTanh *)pCVar12,input);
          goto LAB_0045f831;
        }
        goto LAB_0045eff4;
      }
      if (0x31 < uVar6) {
        if (uVar6 < 0x46) {
          if (uVar6 == 0x32) {
            if (cVar10 == -0x6e) {
              if (this->_oneof_case_[0] == 0x32) {
                this_05 = (this->NonlinearityType_).elu_;
              }
              else {
                clear_NonlinearityType(this);
                this->_oneof_case_[0] = 0x32;
                this_05 = (ActivationELU *)operator_new(0x18);
                ActivationELU::ActivationELU(this_05);
                (this->NonlinearityType_).elu_ = this_05;
              }
              puVar4 = input->buffer_;
              if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
                input->buffer_ = puVar4 + 1;
              }
              else {
                iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
                if (iVar7 < 0) {
                  return false;
                }
              }
              pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                (input,iVar7);
              if ((long)pVar9 < 0) {
                return false;
              }
              bVar5 = ActivationELU::MergePartialFromCodedStream(this_05,input);
              goto LAB_0045f866;
            }
          }
          else if ((uVar6 == 0x3c) && (cVar10 == -0x1e)) {
            if (this->_oneof_case_[0] != 0x3c) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x3c;
              this_00 = (ActivationSoftsign *)operator_new(0x18);
              ActivationSoftsign::ActivationSoftsign(this_00);
              (this->NonlinearityType_).softsign_ = this_00;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pCVar12 = input;
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = ActivationSoftsign::MergePartialFromCodedStream
                              ((ActivationSoftsign *)pCVar12,input);
LAB_0045f831:
            if (bVar5 == false) {
              return false;
            }
            limit = pVar9.first;
            goto LAB_0045f870;
          }
        }
        else if (uVar6 == 0x46) {
          if (cVar10 == '2') {
            if (this->_oneof_case_[0] != 0x46) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x46;
              this_02 = (ActivationSoftplus *)operator_new(0x18);
              ActivationSoftplus::ActivationSoftplus(this_02);
              (this->NonlinearityType_).softplus_ = this_02;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pCVar12 = input;
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = ActivationSoftplus::MergePartialFromCodedStream
                              ((ActivationSoftplus *)pCVar12,input);
            goto LAB_0045f831;
          }
        }
        else if ((uVar6 == 0x47) && (cVar10 == ':')) {
          if (this->_oneof_case_[0] == 0x47) {
            this_07 = (this->NonlinearityType_).parametricsoftplus_;
          }
          else {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x47;
            this_07 = (ActivationParametricSoftplus *)operator_new(0x28);
            ActivationParametricSoftplus::ActivationParametricSoftplus(this_07);
            (this->NonlinearityType_).parametricsoftplus_ = this_07;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = ActivationParametricSoftplus::MergePartialFromCodedStream(this_07,input);
          goto LAB_0045f866;
        }
        goto LAB_0045eff4;
      }
      if (uVar6 != 0x1f) {
        if (uVar6 == 0x28) {
          if (cVar10 == 'B') {
            if (this->_oneof_case_[0] != 0x28) {
              clear_NonlinearityType(this);
              this->_oneof_case_[0] = 0x28;
              this_03 = (ActivationSigmoid *)operator_new(0x18);
              ActivationSigmoid::ActivationSigmoid(this_03);
              (this->NonlinearityType_).sigmoid_ = this_03;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pCVar12 = input;
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = ActivationSigmoid::MergePartialFromCodedStream
                              ((ActivationSigmoid *)pCVar12,input);
            goto LAB_0045f831;
          }
        }
        else if ((uVar6 == 0x29) && (cVar10 == 'J')) {
          if (this->_oneof_case_[0] == 0x29) {
            this_11 = (this->NonlinearityType_).sigmoidhard_;
          }
          else {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x29;
            this_11 = (ActivationSigmoidHard *)operator_new(0x20);
            ActivationSigmoidHard::ActivationSigmoidHard(this_11);
            (this->NonlinearityType_).sigmoidhard_ = this_11;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = ActivationSigmoidHard::MergePartialFromCodedStream(this_11,input);
          goto LAB_0045f866;
        }
        goto LAB_0045eff4;
      }
      if (cVar10 != -6) goto LAB_0045eff4;
      if (this->_oneof_case_[0] == 0x1f) {
        this_06 = (this->NonlinearityType_).scaledtanh_;
      }
      else {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x1f;
        this_06 = (ActivationScaledTanh *)operator_new(0x20);
        ActivationScaledTanh::ActivationScaledTanh(this_06);
        (this->NonlinearityType_).scaledtanh_ = this_06;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = ActivationScaledTanh::MergePartialFromCodedStream(this_06,input);
LAB_0045f866:
      if (bVar5 == false) {
        return false;
      }
      limit = pVar9.first;
LAB_0045f870:
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,limit);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ActivationParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ActivationParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.ActivationLinear linear = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linear()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationReLU ReLU = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_relu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationLeakyReLU leakyReLU = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_leakyrelu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationThresholdedReLU thresholdedReLU = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_thresholdedrelu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationPReLU PReLU = 25;
      case 25: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(202u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_prelu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationTanh tanh = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tanh()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationScaledTanh scaledTanh = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scaledtanh()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSigmoid sigmoid = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSigmoidHard sigmoidHard = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(330u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoidhard()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationELU ELU = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_elu()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSoftsign softsign = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softsign()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationSoftplus softplus = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(562u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softplus()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ActivationParametricSoftplus parametricSoftplus = 71;
      case 71: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(570u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_parametricsoftplus()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ActivationParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ActivationParams)
  return false;
#undef DO_
}